

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * sbuf_read(char *pathname)

{
  int iVar1;
  int local_24;
  char *pcStack_20;
  int len;
  char *buf;
  char *pathname_local;
  
  buf = pathname;
  iVar1 = buf_read(pathname,&stack0xffffffffffffffe0,&local_24);
  if (iVar1 < 0) {
    free(pcStack_20);
    pathname_local = (char *)0x0;
  }
  else {
    pathname_local = pcStack_20;
  }
  return pathname_local;
}

Assistant:

char *sbuf_read(const char *pathname) {
  char *buf;
  int len;

  if (buf_read(pathname, &buf, &len) < 0) {
    FREE(buf);
    buf = NULL;
    return NULL;
  }
  return buf;
}